

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsValidLodOperand(ValidationState_t *_,Op opcode)

{
  Op opcode_local;
  ValidationState_t *__local;
  
  if ((opcode - OpImageRead < 2) || (opcode == OpImageSparseRead)) {
    __local._7_1_ = ValidationState_t::HasCapability(_,CapabilityImageReadWriteLodAMD);
  }
  else {
    __local._7_1_ = IsExplicitLod(opcode);
  }
  return __local._7_1_;
}

Assistant:

bool IsValidLodOperand(const ValidationState_t& _, spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpImageRead:
    case spv::Op::OpImageWrite:
    case spv::Op::OpImageSparseRead:
      return _.HasCapability(spv::Capability::ImageReadWriteLodAMD);
    default:
      return IsExplicitLod(opcode);
  }
}